

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SimpleStringTest.cpp
# Opt level: O2

void __thiscall
TEST_SimpleString_MaskedBits16Bit_Test::testBody(TEST_SimpleString_MaskedBits16Bit_Test *this)

{
  UtestShell *pUVar1;
  char *pcVar2;
  TestTerminator *pTVar3;
  SimpleString local_20;
  
  pUVar1 = UtestShell::getCurrent();
  StringFromMaskedBits((unsigned_long)&local_20,0,0);
  pcVar2 = SimpleString::asCharString(&local_20);
  pTVar3 = UtestShell::getCurrentTestTerminator();
  (*pUVar1->_vptr_UtestShell[9])
            (pUVar1,"xxxxxxxx xxxxxxxx",pcVar2,0,
             "/workspace/llm4binary/github/license_all_cmakelists_25/offa[P]cpputest/tests/CppUTest/SimpleStringTest.cpp"
             ,0x485,pTVar3);
  SimpleString::~SimpleString(&local_20);
  pUVar1 = UtestShell::getCurrent();
  StringFromMaskedBits((unsigned_long)&local_20,0,0xffff);
  pcVar2 = SimpleString::asCharString(&local_20);
  pTVar3 = UtestShell::getCurrentTestTerminator();
  (*pUVar1->_vptr_UtestShell[9])
            (pUVar1,"00000000 00000000",pcVar2,0,
             "/workspace/llm4binary/github/license_all_cmakelists_25/offa[P]cpputest/tests/CppUTest/SimpleStringTest.cpp"
             ,0x486,pTVar3);
  SimpleString::~SimpleString(&local_20);
  pUVar1 = UtestShell::getCurrent();
  StringFromMaskedBits((unsigned_long)&local_20,0xffff,0xffff);
  pcVar2 = SimpleString::asCharString(&local_20);
  pTVar3 = UtestShell::getCurrentTestTerminator();
  (*pUVar1->_vptr_UtestShell[9])
            (pUVar1,"11111111 11111111",pcVar2,0,
             "/workspace/llm4binary/github/license_all_cmakelists_25/offa[P]cpputest/tests/CppUTest/SimpleStringTest.cpp"
             ,0x487,pTVar3);
  SimpleString::~SimpleString(&local_20);
  pUVar1 = UtestShell::getCurrent();
  StringFromMaskedBits((unsigned_long)&local_20,0x8000,0x8000);
  pcVar2 = SimpleString::asCharString(&local_20);
  pTVar3 = UtestShell::getCurrentTestTerminator();
  (*pUVar1->_vptr_UtestShell[9])
            (pUVar1,"1xxxxxxx xxxxxxxx",pcVar2,0,
             "/workspace/llm4binary/github/license_all_cmakelists_25/offa[P]cpputest/tests/CppUTest/SimpleStringTest.cpp"
             ,0x488,pTVar3);
  SimpleString::~SimpleString(&local_20);
  pUVar1 = UtestShell::getCurrent();
  StringFromMaskedBits((unsigned_long)&local_20,1,1);
  pcVar2 = SimpleString::asCharString(&local_20);
  pTVar3 = UtestShell::getCurrentTestTerminator();
  (*pUVar1->_vptr_UtestShell[9])
            (pUVar1,"xxxxxxxx xxxxxxx1",pcVar2,0,
             "/workspace/llm4binary/github/license_all_cmakelists_25/offa[P]cpputest/tests/CppUTest/SimpleStringTest.cpp"
             ,0x489,pTVar3);
  SimpleString::~SimpleString(&local_20);
  pUVar1 = UtestShell::getCurrent();
  StringFromMaskedBits((unsigned_long)&local_20,0xffff,0xcccc);
  pcVar2 = SimpleString::asCharString(&local_20);
  pTVar3 = UtestShell::getCurrentTestTerminator();
  (*pUVar1->_vptr_UtestShell[9])
            (pUVar1,"11xx11xx 11xx11xx",pcVar2,0,
             "/workspace/llm4binary/github/license_all_cmakelists_25/offa[P]cpputest/tests/CppUTest/SimpleStringTest.cpp"
             ,0x48a,pTVar3);
  SimpleString::~SimpleString(&local_20);
  return;
}

Assistant:

TEST(SimpleString, MaskedBits16Bit)
{
    STRCMP_EQUAL("xxxxxxxx xxxxxxxx", StringFromMaskedBits(0x0000, 0x0000, 2*8/CPPUTEST_CHAR_BIT).asCharString());
    STRCMP_EQUAL("00000000 00000000", StringFromMaskedBits(0x0000, 0xFFFF, 2*8/CPPUTEST_CHAR_BIT).asCharString());
    STRCMP_EQUAL("11111111 11111111", StringFromMaskedBits(0xFFFF, 0xFFFF, 2*8/CPPUTEST_CHAR_BIT).asCharString());
    STRCMP_EQUAL("1xxxxxxx xxxxxxxx", StringFromMaskedBits(0x8000, 0x8000, 2*8/CPPUTEST_CHAR_BIT).asCharString());
    STRCMP_EQUAL("xxxxxxxx xxxxxxx1", StringFromMaskedBits(0x0001, 0x0001, 2*8/CPPUTEST_CHAR_BIT).asCharString());
    STRCMP_EQUAL("11xx11xx 11xx11xx", StringFromMaskedBits(0xFFFF, 0xCCCC, 2*8/CPPUTEST_CHAR_BIT).asCharString());
}